

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

bool __thiscall
VulkanHppGenerator::allVectorSizesSupported
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
          *params,map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  *vectorParams)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var3 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var2 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var3; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    bVar1 = TypeInfo::isValue(&(params->
                               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               )._M_impl.super__Vector_impl_data._M_start[(long)p_Var2[1]._M_parent]
                               .type);
    if (!bVar1) break;
    bVar1 = std::operator==(&(params->
                             super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                             )._M_impl.super__Vector_impl_data._M_start[(long)p_Var2[1]._M_parent].
                             type.type,"uint32_t");
    if (!bVar1) {
      bVar1 = std::operator==(&(params->
                               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               )._M_impl.super__Vector_impl_data._M_start[(long)p_Var2[1]._M_parent]
                               .type.type,"VkDeviceSize");
      if (!bVar1) {
        bVar1 = std::operator==(&(params->
                                 super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [(long)p_Var2[1]._M_parent].type.type,"VkSampleCountFlagBits");
        if (!bVar1) break;
      }
    }
  }
  return (_Rb_tree_header *)p_Var2 == p_Var3;
}

Assistant:

bool VulkanHppGenerator::allVectorSizesSupported( std::vector<ParamData> const & params, std::map<size_t, VectorParamData> const & vectorParams ) const
{
  // check if all vector sizes are by value and their type is one of "uint32_t", "VkDeviceSize", or "VkSampleCountFlagBits"
  return std::ranges::all_of( vectorParams,
                              [&params]( auto const & vpi )
                              {
                                return params[vpi.second.lenParam].type.isValue() && ( ( params[vpi.second.lenParam].type.type == "uint32_t" ) ||
                                                                                       ( params[vpi.second.lenParam].type.type == "VkDeviceSize" ) ||
                                                                                       ( params[vpi.second.lenParam].type.type == "VkSampleCountFlagBits" ) );
                              } );
}